

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O2

string * __thiscall
t_lua_generator::render_const_value_abi_cxx11_
          (string *__return_storage_ptr__,t_lua_generator *this,t_type *type,t_const_value *value)

{
  int *piVar1;
  uint uVar2;
  _func_int *p_Var3;
  __type _Var4;
  int iVar5;
  t_const_value_type tVar6;
  t_type *ptVar7;
  undefined4 extraout_var;
  ostream *poVar8;
  _Rb_tree_header *p_Var9;
  _Base_ptr p_Var10;
  int64_t iVar11;
  ostringstream *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var_02;
  _func_int **pp_Var12;
  char *pcVar13;
  t_type *ptVar14;
  pointer pptVar15;
  undefined1 auVar16 [12];
  string local_218;
  string *local_1f8;
  t_type *local_1f0;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream out;
  
  this_00 = (ostringstream *)&out;
  local_1f8 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(this_00);
  ptVar7 = t_type::get_true_type(type);
  iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[5])(ptVar7);
  if ((char)iVar5 == '\0') {
    iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[10])(ptVar7);
    if ((char)iVar5 == '\0') {
      iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xb])(ptVar7);
      if (((char)iVar5 == '\0') &&
         (iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xc])(ptVar7), (char)iVar5 == '\0')) {
        iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0x10])(ptVar7);
        pp_Var12 = (ptVar7->super_t_doc)._vptr_t_doc;
        if ((char)iVar5 == '\0') {
          iVar5 = (*pp_Var12[0xe])(ptVar7);
          if (((char)iVar5 != '\0') ||
             (iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xf])(ptVar7), (char)iVar5 != '\0')) {
            (*(ptVar7->super_t_doc)._vptr_t_doc[0xe])(ptVar7);
            ptVar14 = *(t_type **)&ptVar7[1].super_t_doc.has_doc_;
            iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[3])(ptVar7);
            poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                                     (string *)CONCAT44(extraout_var_01,iVar5));
            poVar8 = std::operator<<(poVar8," = {");
            std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
            pptVar15 = (value->listVal_).
                       super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl
                       .super__Vector_impl_data._M_start;
            while (pptVar15 !=
                   (value->listVal_).
                   super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                   super__Vector_impl_data._M_finish) {
              t_generator::indent((t_generator *)this,
                                  &out.super_basic_ostream<char,_std::char_traits<char>_>);
              poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,"[");
              render_const_value_abi_cxx11_(&local_218,this,ptVar14,*pptVar15);
              poVar8 = std::operator<<(poVar8,(string *)&local_218);
              std::operator<<(poVar8,"]");
              std::__cxx11::string::~string((string *)&local_218);
              iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[0xf])(ptVar7);
              pcVar13 = " = false";
              if ((char)iVar5 != '\0') {
                pcVar13 = " = true";
              }
              std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,pcVar13);
              pptVar15 = pptVar15 + 1;
              if (pptVar15 !=
                  (value->listVal_).
                  super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,","
                                        );
                std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
              }
            }
            std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,"}");
          }
        }
        else {
          iVar5 = (*pp_Var12[3])(ptVar7);
          poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                                   (string *)CONCAT44(extraout_var_00,iVar5));
          poVar8 = std::operator<<(poVar8,"{");
          std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
          ptVar14 = *(t_type **)&ptVar7[1].super_t_doc.has_doc_;
          local_1f0 = *(t_type **)&ptVar7[1].annotations_._M_t._M_impl;
          p_Var10 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var9 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
          while ((_Rb_tree_header *)p_Var10 != p_Var9) {
            poVar8 = t_generator::indent((t_generator *)this,
                                         &out.super_basic_ostream<char,_std::char_traits<char>_>);
            poVar8 = std::operator<<(poVar8,"[");
            render_const_value_abi_cxx11_(&local_218,this,ptVar14,*(t_const_value **)(p_Var10 + 1));
            poVar8 = std::operator<<(poVar8,(string *)&local_218);
            poVar8 = std::operator<<(poVar8,"] = ");
            render_const_value_abi_cxx11_
                      (&local_1e8,this,local_1f0,(t_const_value *)p_Var10[1]._M_parent);
            std::operator<<(poVar8,(string *)&local_1e8);
            std::__cxx11::string::~string((string *)&local_1e8);
            std::__cxx11::string::~string((string *)&local_218);
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
            if ((_Rb_tree_header *)p_Var10 != p_Var9) {
              std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,",");
            }
            std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                            (string *)&::endl_abi_cxx11_);
          }
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          poVar8 = t_generator::indent((t_generator *)this,
                                       &out.super_basic_ostream<char,_std::char_traits<char>_>);
          std::operator<<(poVar8,"}");
        }
      }
      else {
        iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[3])(ptVar7);
        poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                                 (string *)CONCAT44(extraout_var,iVar5));
        poVar8 = std::operator<<(poVar8," = {");
        std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        p_Var10 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var9 = &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
        while ((_Rb_tree_header *)p_Var10 != p_Var9) {
          ptVar14 = (t_type *)0x0;
          for (pp_Var12 = ptVar7[1].super_t_doc._vptr_t_doc;
              pp_Var12 != (_func_int **)ptVar7[1].super_t_doc.doc_._M_dataplus._M_p;
              pp_Var12 = pp_Var12 + 1) {
            p_Var3 = *pp_Var12;
            std::__cxx11::string::string
                      ((string *)&local_218,(string *)(*(long *)(p_Var10 + 1) + 0x48));
            _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(p_Var3 + 0x68),&local_218);
            std::__cxx11::string::~string((string *)&local_218);
            if (_Var4) {
              ptVar14 = *(t_type **)(*pp_Var12 + 0x60);
            }
          }
          if (ptVar14 == (t_type *)0x0) {
            __return_storage_ptr___00 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
            iVar5 = (*(ptVar7->super_t_doc)._vptr_t_doc[3])(ptVar7);
            std::operator+(&local_1e8,"type error: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_02,iVar5));
            std::operator+(&local_218,&local_1e8," has no field ");
            std::__cxx11::string::string
                      ((string *)&local_1c8,(string *)(*(long *)(p_Var10 + 1) + 0x48));
            std::operator+(__return_storage_ptr___00,&local_218,&local_1c8);
            __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                        std::__cxx11::string::~string);
          }
          t_generator::indent((t_generator *)this,
                              &out.super_basic_ostream<char,_std::char_traits<char>_>);
          render_const_value_abi_cxx11_
                    (&local_218,this,g_type_string,*(t_const_value **)(p_Var10 + 1));
          std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                          (string *)&local_218);
          std::__cxx11::string::~string((string *)&local_218);
          std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>," = ");
          render_const_value_abi_cxx11_
                    (&local_218,this,ptVar14,(t_const_value *)p_Var10[1]._M_parent);
          std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                          (string *)&local_218);
          std::__cxx11::string::~string((string *)&local_218);
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
          if ((_Rb_tree_header *)p_Var10 != p_Var9) {
            std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,",");
          }
        }
        std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,"}");
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
      }
    }
    else {
      t_const_value::get_integer(value);
      std::ostream::_M_insert<long>((long)&out);
    }
    goto LAB_0023c2b2;
  }
  uVar2 = *(uint *)&ptVar7[1].super_t_doc._vptr_t_doc;
  switch(uVar2) {
  case 1:
    poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,"\'");
    std::__cxx11::string::string((string *)&local_218,(string *)&value->stringVal_);
    poVar8 = std::operator<<(poVar8,(string *)&local_218);
    std::operator<<(poVar8,"\'");
    std::__cxx11::string::~string((string *)&local_218);
    goto LAB_0023c2b2;
  case 2:
    iVar11 = t_const_value::get_integer(value);
    pcVar13 = "false";
    if (0 < iVar11) {
      pcVar13 = "true";
    }
    break;
  case 3:
  case 4:
  case 5:
    goto switchD_0023bd36_caseD_3;
  case 6:
    poVar8 = std::operator<<(&out.super_basic_ostream<char,_std::char_traits<char>_>,
                             "lualongnumber.new(\'");
    t_const_value::get_integer(value);
    this_00 = (ostringstream *)std::ostream::_M_insert<long>((long)poVar8);
    pcVar13 = "\')";
    break;
  case 7:
    tVar6 = t_const_value::get_type(value);
    if (tVar6 != CV_INTEGER) {
      std::ostream::_M_insert<double>(value->doubleVal_);
      goto LAB_0023c2b2;
    }
    goto switchD_0023bd36_caseD_3;
  default:
    auVar16 = __cxa_allocate_exception(0x20);
    t_base_type::t_base_name_abi_cxx11_(&local_218,(t_base_type *)(ulong)uVar2,auVar16._8_4_);
    std::operator+(auVar16._0_8_,"compiler error: no const of base type ",&local_218);
    __cxa_throw(auVar16._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  std::operator<<((ostream *)this_00,pcVar13);
LAB_0023c2b2:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  return local_1f8;
switchD_0023bd36_caseD_3:
  t_const_value::get_integer(value);
  std::ostream::_M_insert<long>((long)&out);
  goto LAB_0023c2b2;
}

Assistant:

string t_lua_generator::render_const_value(t_type* type, t_const_value* value) {
  std::ostringstream out;

  type = get_true_type(type);
  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      out << "'" << value->get_string() << "'";
      break;
    case t_base_type::TYPE_BOOL:
      out << (value->get_integer() > 0 ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
      out << value->get_integer();
      break;
    case t_base_type::TYPE_I64:
      out << "lualongnumber.new('" << value->get_integer() << "')";
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        out << value->get_integer();
      } else {
        out << value->get_double();
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    out << value->get_integer();
  } else if (type->is_struct() || type->is_xception()) {
    out << type->get_name() << " = {" << endl;
    indent_up();

    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end();) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }

      indent(out);
      out << render_const_value(g_type_string, v_iter->first);
      out << " = ";
      out << render_const_value(field_type, v_iter->second);
      ++v_iter;
      if (v_iter != val.end()) {
        out << ",";
      }
    }

    out << "}";
    indent_down();
  } else if (type->is_map()) {
    out << type->get_name() << "{" << endl;
    indent_up();

    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();

    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end();) {
      indent(out) << "[" << render_const_value(ktype, v_iter->first)
                  << "] = " << render_const_value(vtype, v_iter->second);
      ++v_iter;
      if (v_iter != val.end()) {
        out << ",";
      }
      out << endl;
    }
    indent_down();
    indent(out) << "}";
  } else if (type->is_list() || type->is_set()) {
    t_type* etype;
    if (type->is_list()) {
      etype = ((t_list*)type)->get_elem_type();
    } else {
      etype = ((t_set*)type)->get_elem_type();
    }
    out << type->get_name() << " = {" << endl;
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end();) {
      indent(out);
      out << "[" << render_const_value(etype, *v_iter) << "]";
      if (type->is_set()) {
        out << " = true";
      } else {
        out << " = false";
      }
      ++v_iter;
      if (v_iter != val.end()) {
        out << "," << endl;
      }
    }
    out << "}";
  }
  return out.str();
}